

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_save.cpp
# Opt level: O0

void save_list_proc(ostream *os,Am_Load_Save_Context *context,Am_Value *value)

{
  bool bVar1;
  unsigned_short uVar2;
  void *this;
  Am_Value *value_00;
  undefined1 local_30 [8];
  Am_Value_List list;
  Am_Value *value_local;
  Am_Load_Save_Context *context_local;
  ostream *os_local;
  
  list.item = (Am_List_Item *)value;
  Am_Load_Save_Context::Save_Type_Name(context,os,"Am_VALUE_LIST");
  Am_Value_List::Am_Value_List((Am_Value_List *)local_30,&(list.item)->super_Am_Value);
  uVar2 = Am_Value_List::Length((Am_Value_List *)local_30);
  this = (void *)std::ostream::operator<<(os,uVar2);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  Am_Value_List::Start((Am_Value_List *)local_30);
  while( true ) {
    bVar1 = Am_Value_List::Last((Am_Value_List *)local_30);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    value_00 = Am_Value_List::Get((Am_Value_List *)local_30);
    Am_Load_Save_Context::Save(context,os,value_00);
    Am_Value_List::Next((Am_Value_List *)local_30);
  }
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_30);
  return;
}

Assistant:

Am_Define_Method(Am_Save_Method, void, save_list,
                 (std::ostream & os, Am_Load_Save_Context &context,
                  const Am_Value &value))
{
  context.Save_Type_Name(os, "Am_VALUE_LIST");
  Am_Value_List list = value;
  os << list.Length() << std::endl;
  for (list.Start(); !list.Last(); list.Next())
    context.Save(os, list.Get());
}